

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  byte *pbVar6;
  ulong uVar7;
  long lVar8;
  stbi_uc sVar9;
  int iVar10;
  ulong uVar11;
  char *pcVar12;
  int iVar13;
  stbi_uc *psVar14;
  int iVar15;
  stbi_uc local_a08 [31];
  byte bStack_9e9;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header != 0) {
    pbVar6 = a->zbuffer;
    uVar1 = 0;
    if (pbVar6 < a->zbuffer_end) {
      a->zbuffer = pbVar6 + 1;
      uVar2 = (uint)*pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    else {
      uVar2 = 0;
    }
    if (pbVar6 < a->zbuffer_end) {
      a->zbuffer = pbVar6 + 1;
      uVar1 = (uint)*pbVar6;
    }
    if ((((uVar1 & 0x20) != 0) || ((short)((uVar2 << 8 | uVar1) % 0x1f) != 0)) ||
       ((uVar2 & 0xf) != 8)) {
      stbi__g_failure_reason = "Corrupt PNG";
      return 0;
    }
  }
  a->num_bits = 0;
  a->code_buffer = 0;
  z = &a->z_length;
  do {
    uVar1 = stbi__zreceive(a,1);
    uVar2 = stbi__zreceive(a,2);
    if (uVar2 == 0) {
      uVar2 = a->num_bits;
      if ((uVar2 & 7) != 0) {
        stbi__zreceive(a,uVar2 & 7);
        uVar2 = a->num_bits;
      }
      uVar7 = 0;
      while (0 < (int)uVar2) {
        uVar3 = a->code_buffer;
        *(char *)((long)z_codelength.fast + uVar7) = (char)uVar3;
        uVar7 = uVar7 + 1;
        a->code_buffer = uVar3 >> 8;
        uVar2 = uVar2 - 8;
        a->num_bits = uVar2;
      }
      if (uVar2 != 0) {
        __assert_fail("a->num_bits == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/aaamp[P]entropy-experiment/thirdparty/SFML/extlibs/headers/stb_image/stb_image.h"
                      ,0xfc1,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
      }
      for (; uVar7 < 4; uVar7 = uVar7 + 1) {
        psVar14 = a->zbuffer;
        if (psVar14 < a->zbuffer_end) {
          a->zbuffer = psVar14 + 1;
          sVar9 = *psVar14;
        }
        else {
          sVar9 = '\0';
        }
        *(stbi_uc *)((long)z_codelength.fast + uVar7) = sVar9;
      }
      if ((z_codelength.fast[1] ^ z_codelength.fast[0]) != 0xffff) {
LAB_00116519:
        stbi__g_failure_reason = "Corrupt PNG";
        return 0;
      }
      psVar14 = a->zbuffer;
      uVar7 = (ulong)z_codelength.fast[0];
      if (a->zbuffer_end < psVar14 + uVar7) goto LAB_00116519;
      pcVar12 = a->zout;
      if (a->zout_end < pcVar12 + uVar7) {
        iVar5 = stbi__zexpand(a,pcVar12,(uint)z_codelength.fast[0]);
        if (iVar5 == 0) {
          return 0;
        }
        psVar14 = a->zbuffer;
        pcVar12 = a->zout;
      }
      memcpy(pcVar12,psVar14,uVar7);
      a->zbuffer = a->zbuffer + uVar7;
      a->zout = a->zout + uVar7;
    }
    else {
      if (uVar2 == 1) {
        iVar5 = stbi__zbuild_huffman
                          (z,
                           "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                           ,0x120);
        if (iVar5 == 0) {
          return 0;
        }
        psVar14 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar10 = 0x20;
      }
      else {
        if (uVar2 == 3) {
          return 0;
        }
        uVar2 = stbi__zreceive(a,5);
        uVar3 = stbi__zreceive(a,5);
        uVar4 = stbi__zreceive(a,4);
        local_a08[0] = '\0';
        local_a08[1] = '\0';
        local_a08[2] = '\0';
        local_a08[3] = '\0';
        local_a08[4] = '\0';
        local_a08[5] = '\0';
        local_a08[6] = '\0';
        local_a08[7] = '\0';
        local_a08[8] = '\0';
        local_a08[9] = '\0';
        local_a08[10] = '\0';
        local_a08[0xb] = '\0';
        local_a08[0xc] = '\0';
        local_a08[0xd] = '\0';
        local_a08[0xe] = '\0';
        local_a08[0xf] = '\0';
        local_a08[0x10] = '\0';
        local_a08[0x11] = '\0';
        local_a08[0x12] = '\0';
        uVar7 = (ulong)(uVar4 + 4);
        if ((int)(uVar4 + 4) < 1) {
          uVar7 = 0;
        }
        for (uVar11 = 0; uVar7 != uVar11; uVar11 = uVar11 + 1) {
          uVar4 = stbi__zreceive(a,3);
          local_a08[(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar11]] =
               (stbi_uc)uVar4;
        }
        iVar5 = stbi__zbuild_huffman(&z_codelength,local_a08,0x13);
        if (iVar5 == 0) {
          return 0;
        }
        iVar10 = uVar3 + 1;
        iVar13 = uVar3 + uVar2 + 0x102;
        iVar5 = 0;
        while( true ) {
          if (iVar13 <= iVar5) break;
          uVar3 = stbi__zhuffman_decode(a,&z_codelength);
          if (0x12 < uVar3) goto LAB_00116519;
          if (uVar3 < 0x10) {
            lencodes[iVar5] = (stbi_uc)uVar3;
            iVar5 = iVar5 + 1;
          }
          else {
            if (uVar3 == 0x11) {
              uVar3 = stbi__zreceive(a,3);
              iVar15 = uVar3 + 3;
LAB_00116255:
              uVar3 = 0;
            }
            else {
              if (uVar3 != 0x10) {
                uVar3 = stbi__zreceive(a,7);
                iVar15 = uVar3 + 0xb;
                goto LAB_00116255;
              }
              uVar3 = stbi__zreceive(a,2);
              if (iVar5 == 0) goto LAB_00116519;
              iVar15 = uVar3 + 3;
              uVar3 = (uint)lencodes[(long)iVar5 + -1];
            }
            if (iVar13 - iVar5 < iVar15) goto LAB_00116519;
            memset(lencodes + iVar5,uVar3,(long)iVar15);
            iVar5 = iVar5 + iVar15;
          }
        }
        if (iVar13 != iVar5) goto LAB_00116519;
        iVar5 = stbi__zbuild_huffman(z,lencodes,uVar2 + 0x101);
        if (iVar5 == 0) {
          return 0;
        }
        psVar14 = lencodes + (int)(uVar2 + 0x101);
      }
      iVar5 = stbi__zbuild_huffman(&a->z_distance,psVar14,iVar10);
      if (iVar5 == 0) {
        return 0;
      }
      pcVar12 = a->zout;
      while( true ) {
        while (iVar5 = stbi__zhuffman_decode(a,z), iVar5 < 0x100) {
          if (iVar5 < 0) goto LAB_00116519;
          if (a->zout_end <= pcVar12) {
            iVar10 = stbi__zexpand(a,pcVar12,1);
            if (iVar10 == 0) {
              return 0;
            }
            pcVar12 = a->zout;
          }
          *pcVar12 = (char)iVar5;
          pcVar12 = pcVar12 + 1;
        }
        if (iVar5 == 0x100) break;
        uVar7 = (ulong)(iVar5 - 0x101);
        uVar2 = stbi__zlength_base[uVar7];
        if (0xffffffffffffffeb < uVar7 - 0x1c) {
          uVar3 = stbi__zreceive(a,stbi__zlength_extra[uVar7]);
          uVar2 = uVar2 + uVar3;
        }
        uVar3 = stbi__zhuffman_decode(a,&a->z_distance);
        if ((int)uVar3 < 0) goto LAB_00116519;
        uVar7 = (ulong)uVar3;
        iVar5 = stbi__zdist_base[uVar7];
        if (0xffffffffffffffe5 < uVar7 - 0x1e) {
          uVar3 = stbi__zreceive(a,stbi__zdist_extra[uVar7]);
          iVar5 = iVar5 + uVar3;
        }
        if ((long)pcVar12 - (long)a->zout_start < (long)iVar5) goto LAB_00116519;
        if (a->zout_end < pcVar12 + (int)uVar2) {
          iVar10 = stbi__zexpand(a,pcVar12,uVar2);
          if (iVar10 == 0) {
            return 0;
          }
          pcVar12 = a->zout;
        }
        lVar8 = -(long)iVar5;
        if (iVar5 == 1) {
          if (uVar2 != 0) {
            memset(pcVar12,(uint)(byte)pcVar12[lVar8],(ulong)uVar2);
            pcVar12 = pcVar12 + (ulong)(uVar2 - 1) + 1;
          }
        }
        else {
          for (; uVar2 != 0; uVar2 = uVar2 - 1) {
            *pcVar12 = pcVar12[lVar8];
            pcVar12 = pcVar12 + 1;
          }
        }
      }
      a->zout = pcVar12;
    }
    if (uVar1 != 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}